

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_stream.h
# Opt level: O0

int __thiscall crnlib::dynamic_stream::close(dynamic_stream *this,int __fd)

{
  dynamic_stream *pdVar1;
  bool bVar2;
  dynamic_stream *this_local;
  
  pdVar1 = (dynamic_stream *)
           (CONCAT71((int7)((ulong)this >> 8),(this->super_data_stream).field_0x1a) &
           0xffffffffffffff01);
  bVar2 = (char)pdVar1 != '\0';
  if (bVar2) {
    (this->super_data_stream).field_0x1a = (this->super_data_stream).field_0x1a & 0xfe;
    vector<unsigned_char>::clear(&this->m_buf);
    this->m_ofs = 0;
    pdVar1 = this;
  }
  return (int)CONCAT71((int7)((ulong)pdVar1 >> 8),bVar2);
}

Assistant:

virtual bool close() {
    if (m_opened) {
      m_opened = false;
      m_buf.clear();
      m_ofs = 0;
      return true;
    }

    return false;
  }